

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O3

PyTypeObject * pybind11::detail::make_default_metaclass(void)

{
  int iVar1;
  handle hVar2;
  PyTypeObject *pPVar3;
  error_already_set *this;
  object name_obj;
  object local_30;
  object local_28;
  
  hVar2.m_ptr = (PyObject *)PyUnicode_FromString("pybind11_type");
  local_28.super_handle.m_ptr = (handle)(handle)hVar2.m_ptr;
  pPVar3 = (PyTypeObject *)(*_operator_delete)(&PyType_Type,0);
  if (pPVar3 == (PyTypeObject *)0x0) {
    pybind11_fail("make_default_metaclass(): error allocating metaclass!");
  }
  if (hVar2.m_ptr != (PyObject *)0x0) {
    (hVar2.m_ptr)->ob_refcnt = (hVar2.m_ptr)->ob_refcnt + 2;
  }
  pPVar3[2].tp_basicsize = (Py_ssize_t)hVar2.m_ptr;
  pPVar3[2].tp_dealloc = (destructor)hVar2.m_ptr;
  pPVar3->tp_name = "pybind11_type";
  pPVar3->tp_base = (_typeobject *)&PyType_Type;
  pPVar3->tp_flags = 0x600;
  pPVar3->tp_setattro = pybind11_meta_setattro;
  pPVar3->tp_getattro = pybind11_meta_getattro;
  iVar1 = PyType_Ready(pPVar3);
  if (-1 < iVar1) {
    str::str((str *)&local_30,"pybind11_builtins");
    iVar1 = PyObject_SetAttrString(pPVar3,"__module__",local_30.super_handle.m_ptr);
    if (iVar1 == 0) {
      object::~object(&local_30);
      object::~object(&local_28);
      return pPVar3;
    }
    this = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this);
    __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  pybind11_fail("make_default_metaclass(): failure in PyType_Ready()!");
}

Assistant:

inline PyTypeObject* make_default_metaclass() {
    constexpr auto *name = "pybind11_type";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto heap_type = (PyHeapTypeObject *) PyType_Type.tp_alloc(&PyType_Type, 0);
    if (!heap_type)
        pybind11_fail("make_default_metaclass(): error allocating metaclass!");

    heap_type->ht_name = name_obj.inc_ref().ptr();
#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = &PyType_Type;
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;

    type->tp_setattro = pybind11_meta_setattro;
#if PY_MAJOR_VERSION >= 3
    type->tp_getattro = pybind11_meta_getattro;
#endif

    if (PyType_Ready(type) < 0)
        pybind11_fail("make_default_metaclass(): failure in PyType_Ready()!");

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));

    return type;
}